

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result spvc_compiler_get_active_interface_variables(spvc_compiler compiler,spvc_set *set)

{
  spvc_context_s *this;
  spvc_context psVar1;
  bool bVar2;
  spvc_set_s *this_00;
  pointer this_01;
  pointer psVar3;
  pointer local_e0;
  exception *e;
  undefined1 local_a0 [8];
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  active;
  allocator local_51;
  string local_50;
  undefined1 local_29;
  unique_ptr<spvc_set_s,_std::default_delete<spvc_set_s>_> local_28;
  unique_ptr<spvc_set_s,_std::default_delete<spvc_set_s>_> ptr;
  spvc_set *set_local;
  spvc_compiler compiler_local;
  
  ptr._M_t.super___uniq_ptr_impl<spvc_set_s,_std::default_delete<spvc_set_s>_>._M_t.
  super__Tuple_impl<0UL,_spvc_set_s_*,_std::default_delete<spvc_set_s>_>.
  super__Head_base<0UL,_spvc_set_s_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvc_set_s,_std::default_delete<spvc_set_s>,_true,_true>)
       (__uniq_ptr_data<spvc_set_s,_std::default_delete<spvc_set_s>,_true,_true>)set;
  this_00 = (spvc_set_s *)operator_new(0x40,(nothrow_t *)&std::nothrow);
  local_29 = 0;
  local_e0 = (pointer)0x0;
  if (this_00 != (spvc_set_s *)0x0) {
    local_29 = 1;
    spvc_set_s::spvc_set_s(this_00);
    local_e0 = this_00;
  }
  std::unique_ptr<spvc_set_s,std::default_delete<spvc_set_s>>::
  unique_ptr<std::default_delete<spvc_set_s>,void>
            ((unique_ptr<spvc_set_s,std::default_delete<spvc_set_s>> *)&local_28,local_e0);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar2) {
    this_01 = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              operator->(&compiler->compiler);
    spirv_cross::Compiler::get_active_interface_variables
              ((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                *)local_a0,this_01);
    psVar3 = std::unique_ptr<spvc_set_s,_std::default_delete<spvc_set_s>_>::operator->(&local_28);
    std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::operator=(&psVar3->set,
                (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                 *)local_a0);
    psVar3 = std::unique_ptr<spvc_set_s,_std::default_delete<spvc_set_s>_>::get(&local_28);
    *(pointer *)
     ptr._M_t.super___uniq_ptr_impl<spvc_set_s,_std::default_delete<spvc_set_s>_>._M_t.
     super__Tuple_impl<0UL,_spvc_set_s_*,_std::default_delete<spvc_set_s>_>.
     super__Head_base<0UL,_spvc_set_s_*,_false>._M_head_impl = psVar3;
    psVar1 = compiler->context;
    std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
    unique_ptr<spvc_set_s,std::default_delete<spvc_set_s>,void>
              ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)
               &e,&local_28);
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&psVar1->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&e);
    std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
    ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&e);
    std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::~unordered_set((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                      *)local_a0);
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Out of memory.",&local_51);
    spvc_context_s::report_error(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    compiler_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
  }
  active._M_h._M_single_bucket._1_3_ = 0;
  active._M_h._M_single_bucket._0_1_ = !bVar2;
  std::unique_ptr<spvc_set_s,_std::default_delete<spvc_set_s>_>::~unique_ptr(&local_28);
  if ((uint)active._M_h._M_single_bucket == 0) {
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_get_active_interface_variables(spvc_compiler compiler, spvc_set *set)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_set_s> ptr(new (std::nothrow) spvc_set_s);
		if (!ptr)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		auto active = compiler->compiler->get_active_interface_variables();
		ptr->set = std::move(active);
		*set = ptr.get();
		compiler->context->allocations.push_back(std::move(ptr));
	}